

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paper_example_all_gather_sparse_vec.c
# Opt level: O0

int all_gather_sparse_vec(float *dense,int n_over_p,float **sparse_out,int **sparse_ivec_out)

{
  int iVar1;
  bsp_pid_t bVar2;
  int *local_58;
  float *sparse;
  int *sparse_ivec;
  int status;
  int nonzeros_size;
  int nonzeros;
  int p;
  int tag_size;
  int j;
  int i;
  int global_idx;
  int **sparse_ivec_out_local;
  float **sparse_out_local;
  float *pfStack_10;
  int n_over_p_local;
  float *dense_local;
  
  sparse = (float *)0x0;
  local_58 = (int *)0x0;
  _i = sparse_ivec_out;
  sparse_ivec_out_local = (int **)sparse_out;
  sparse_out_local._4_4_ = n_over_p;
  pfStack_10 = dense;
  nonzeros_size = bsp_nprocs();
  nonzeros = 4;
  bsp_set_tagsize(&nonzeros);
  bsp_sync();
  for (tag_size = 0; iVar1 = sparse_out_local._4_4_, tag_size < sparse_out_local._4_4_;
      tag_size = tag_size + 1) {
    if ((pfStack_10[tag_size] != 0.0) || (NAN(pfStack_10[tag_size]))) {
      bVar2 = bsp_pid();
      j = iVar1 * bVar2 + tag_size;
      for (p = 0; p < nonzeros_size; p = p + 1) {
        bsp_send(p,&j,pfStack_10 + tag_size,4);
      }
    }
  }
  bsp_sync();
  bsp_qsize(&status,(bsp_size_t *)((long)&sparse_ivec + 4));
  if (0 < status) {
    local_58 = (int *)calloc((long)status,4);
    sparse = (float *)calloc((long)status,4);
    if ((local_58 == (int *)0x0) || (sparse == (float *)0x0)) {
      bsp_abort("Unable to allocate memory\n");
    }
    for (tag_size = 0; tag_size < status; tag_size = tag_size + 1) {
      bsp_get_tag((bsp_size_t *)&sparse_ivec,sparse + tag_size);
      if ((uint)sparse_ivec != 4) {
        printf("TEST FAILED: Expected %s to be equal to %s = %d but got %d\n   /workspace/llm4binary/github/license_all_cmakelists_1510/wijnand-suijlen[P]bsponmpi/test/paper_example_all_gather_sparse_vec.c:%d\n"
               ,"status","(int) sizeof(float)",4,(ulong)(uint)sparse_ivec,0x25);
        abort();
      }
      bsp_move(local_58 + tag_size,4);
    }
  }
  bsp_set_tagsize(&nonzeros);
  *sparse_ivec_out_local = local_58;
  *_i = (int *)sparse;
  return status;
}

Assistant:

int all_gather_sparse_vec( float * dense, int n_over_p,
                            float ** sparse_out,
                            int ** sparse_ivec_out) {
   int global_idx, i, j, tag_size, p, 
       nonzeros, nonzeros_size, status;
   int *sparse_ivec = NULL;
   float *sparse = NULL;

   p = bsp_nprocs();
   tag_size = sizeof(int);
   bsp_set_tagsize(&tag_size);
   bsp_sync();

   for ( i = 0; i < n_over_p; ++i ) {
     if ( dense[i] != 0.0 ) {
       global_idx = n_over_p * bsp_pid() + i;
       for (j = 0; j < p; ++j)
         bsp_send(j, &global_idx, &dense[i], sizeof(float) );
     }
   }
   bsp_sync();

   bsp_qsize( &nonzeros, &nonzeros_size );
   if (nonzeros > 0 ) {
     sparse      = calloc( nonzeros, sizeof(float) );
     sparse_ivec = calloc( nonzeros, sizeof(int) );
     if (sparse == NULL || sparse_ivec == NULL)
       bsp_abort("Unable to allocate memory\n");
 
     for ( i = 0 ; i < nonzeros; ++i) {
       bsp_get_tag( &status, &sparse_ivec[i] );
       EXPECT_EQ( "%d", status, (int) sizeof(float));
       bsp_move( &sparse[i], sizeof(float) );
     }
   }
   bsp_set_tagsize(&tag_size);
   *sparse_out = sparse;
   *sparse_ivec_out = sparse_ivec;
   return nonzeros;
}